

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volid_test.cpp
# Opt level: O2

void __thiscall generated_identifiers_stability::test_method(generated_identifiers_stability *this)

{
  IDENTIFICATION_STRATEGY strategy;
  unit_test_log_t *puVar1;
  bool bVar2;
  FUNCTION_RETURN FVar3;
  int iVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  int num_strategies;
  int extraout_EDX;
  int extraout_EDX_00;
  IDENTIFICATION_STRATEGY *pIVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  allocator local_909;
  IDENTIFICATION_STRATEGY *local_908;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reference_signatures;
  EVENT_TYPE val_result;
  size_type local_8e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_8d8;
  PcSignature pcsig;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  start;
  char *local_868;
  char *local_860;
  undefined1 *local_858;
  undefined1 *local_850;
  char *local_848;
  char *local_840;
  pointer local_838;
  pointer local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  string idfileLocation;
  PcSignature generated_identifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  end;
  string local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  undefined1 local_6b8 [48];
  undefined1 local_688 [48];
  undefined1 local_658 [48];
  undefined1 local_628 [48];
  pointer local_5f8;
  pointer local_5f0;
  pointer local_5e8;
  pointer local_5e0;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  end_1;
  ifstream is;
  string local_438 [512];
  ifstream test_idfile_exist;
  int aiStack_218 [122];
  
  std::__cxx11::string::string
            ((string *)&idfileLocation,"Testing/Temporary/identifiers_file",
             (allocator *)&test_idfile_exist);
  std::ifstream::ifstream(&test_idfile_exist,(string *)&idfileLocation,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(_test_idfile_exist + -0x18)) != 0) {
    generate_reference_file(&idfileLocation,&DAT_004f6020,num_strategies);
    goto LAB_00213f38;
  }
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)&is,(istream_type *)&test_idfile_exist);
  end_1._M_stream = (istream_type *)0x0;
  end_1._M_value._M_dataplus._M_p = (pointer)&end_1._M_value.field_2;
  end_1._M_value._M_string_length = 0;
  end_1._M_value.field_2._M_allocated_capacity =
       end_1._M_value.field_2._M_allocated_capacity & 0xffffffffffffff00;
  end_1._M_ok = false;
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)local_628,
                     (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)&is);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)local_658,&end_1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&start,
             (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
              *)local_628,
             (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
              *)local_658,(allocator_type *)&end);
  std::__cxx11::string::~string((string *)(local_658 + 8));
  std::__cxx11::string::~string((string *)(local_628 + 8));
  std::ifstream::close();
  iVar4 = extraout_EDX;
  if ((long)start._M_value._M_dataplus._M_p - (long)start._M_stream == 0x80) {
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                      (start._M_stream,start._M_value._M_dataplus._M_p,"0000-0000-0000-0000");
    iVar4 = extraout_EDX_00;
    if (_Var5._M_current !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        start._M_value._M_dataplus._M_p) goto LAB_00213f02;
  }
  else {
LAB_00213f02:
    generate_reference_file(&idfileLocation,&DAT_004f6020,iVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&start);
  std::__cxx11::string::~string((string *)&end_1._M_value);
  std::__cxx11::string::~string(local_438);
LAB_00213f38:
  std::ifstream::ifstream(&is,(string *)&idfileLocation,_S_in);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator(&start,(istream_type *)&is);
  end._M_stream = (istream_type *)0x0;
  end._M_value._M_dataplus._M_p = (pointer)&end._M_value.field_2;
  end._M_value._M_string_length = 0;
  end._M_value.field_2._M_local_buf[0] = '\0';
  end._M_ok = false;
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)local_688,&start);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)local_6b8,&end);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &reference_signatures,
             (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
              *)local_688,
             (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
              *)local_6b8,(allocator_type *)&end_1);
  std::__cxx11::string::~string((string *)(local_6b8 + 8));
  std::__cxx11::string::~string((string *)(local_688 + 8));
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_7d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
  ;
  local_7d0 = "";
  memset((basic_wrap_stringstream<char> *)&end_1,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&end_1);
  std::operator<<((ostream *)&end_1,"Generating current signatures and comparing with past");
  pbVar6 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_
                     ((basic_wrap_stringstream<char> *)&end_1);
  local_5e8 = (pbVar6->_M_dataplus)._M_p;
  local_5e0 = local_5e8 + pbVar6->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_7d8,0x57);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&end_1);
  pIVar7 = &DAT_004f6020;
  lVar9 = 0;
  while( true ) {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    if (lVar9 == 0x80) {
      local_818 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
      ;
      local_810 = "";
      memset((basic_wrap_stringstream<char> *)&end_1,0,0x198);
      boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
                ((basic_wrap_stringstream<char> *)&end_1);
      std::operator<<((ostream *)&end_1,"Verifying signatures");
      pbVar6 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_
                         ((basic_wrap_stringstream<char> *)&end_1);
      local_5f8 = (pbVar6->_M_dataplus)._M_p;
      local_5f0 = local_5f8 + pbVar6->_M_string_length;
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_818,0x69);
      boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
                ((basic_wrap_stringstream<char> *)&end_1);
      iVar4 = 0;
      while (iVar4 != 100) {
        local_908 = (IDENTIFICATION_STRATEGY *)CONCAT44(local_908._4_4_,iVar4);
        uVar8 = 0;
        while( true ) {
          uVar10 = (ulong)uVar8;
          if ((ulong)((long)reference_signatures.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)reference_signatures.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10) break;
          bVar2 = std::operator==(reference_signatures.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar10,
                                  "0000-0000-0000-0000");
          if (!bVar2) {
            strncpy(pcsig,reference_signatures.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p,0x14);
            val_result = validate_pc_signature(pcsig);
            puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
            local_828 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
            ;
            local_820 = "";
            memset((basic_wrap_stringstream<char> *)&end_1,0,0x198);
            boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
                      ((basic_wrap_stringstream<char> *)&end_1);
            std::operator<<((ostream *)&end_1,"Verifying signature: ");
            pbVar6 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_
                               ((basic_wrap_stringstream<char> *)&end_1);
            local_838 = (pbVar6->_M_dataplus)._M_p;
            local_830 = local_838 + pbVar6->_M_string_length;
            boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_828,0x72,&local_838);
            boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
                      ((basic_wrap_stringstream<char> *)&end_1);
            local_848 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
            ;
            local_840 = "";
            local_858 = &boost::unit_test::basic_cstring<char_const>::null;
            local_850 = &boost::unit_test::basic_cstring<char_const>::null;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_848,0x73,
                       &local_858);
            end_1._M_value._M_dataplus._M_p = end_1._M_value._M_dataplus._M_p & 0xffffffffffffff00;
            end_1._M_stream = (istream_type *)&PTR__lazy_ostream_00633598;
            end_1._M_value._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
            end_1._M_value.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_8886;
            local_868 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
            ;
            local_860 = "";
            local_768._M_dataplus._M_p._0_4_ = 0;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,EVENT_TYPE,EVENT_TYPE>
                      ((basic_wrap_stringstream<char> *)&end_1,&local_868,0x73,1,2,&val_result,
                       "val_result",&local_768,"LICENSE_OK");
          }
          uVar8 = uVar8 + 1;
        }
        iVar4 = (int)local_908 + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&reference_signatures);
      std::__cxx11::string::~string((string *)&end._M_value);
      std::__cxx11::string::~string((string *)&start._M_value);
      std::ifstream::~ifstream(&is);
      std::ifstream::~ifstream(&test_idfile_exist);
      std::__cxx11::string::~string((string *)&idfileLocation);
      return;
    }
    strategy = *pIVar7;
    FVar3 = generate_user_pc_signature(generated_identifier,strategy);
    if (FVar3 != FUNC_RET_OK) break;
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&((reference_signatures.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar9),generated_identifier);
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)&local_788,"pc signature compare fail: strategy: ",&local_909);
      std::__cxx11::to_string(&local_718,(ulong)strategy);
      std::operator+(&local_6f8,&local_788,&local_718);
      std::operator+(&local_6d8,&local_6f8," generated: [");
      std::operator+(&local_768,&local_6d8,generated_identifier);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &val_result,&local_768,"] reference: [");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcsig,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &val_result,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((reference_signatures.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9
                     ));
      local_908 = pIVar7;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&end_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcsig,"]")
      ;
      std::__cxx11::string::~string((string *)pcsig);
      std::__cxx11::string::~string((string *)&val_result);
      std::__cxx11::string::~string((string *)&local_768);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_718);
      std::__cxx11::string::~string((string *)&local_788);
      local_7e8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
      ;
      local_7e0 = "";
      local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_7e8,0x66);
      val_result = val_result & 0xffffff00;
      local_8e0 = 0;
      aStack_8d8._M_allocated_capacity = 0;
      pcsig[8] = '\0';
      pcsig._0_8_ = &PTR__lazy_ostream_00633668;
      stack0xfffffffffffff748 = boost::unit_test::lazy_ostream::inst;
      local_808 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
      ;
      local_800 = "";
      boost::test_tools::tt_detail::report_assertion(&val_result,pcsig,&local_808,0x66,1,1,0);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_8d8._M_allocated_capacity);
      std::__cxx11::string::~string((string *)&end_1);
      pIVar7 = local_908;
    }
    lVar9 = lVar9 + 0x20;
    pIVar7 = pIVar7 + 1;
  }
  __assert_fail("generate_ok == FUNCTION_RETURN::FUNC_RET_OK",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
                ,0x5c,"void generated_identifiers_stability::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(generated_identifiers_stability) {
	const string idfileLocation(PROJECT_TEST_TEMP_DIR "/identifiers_file");
	IDENTIFICATION_STRATEGY strategies[] =
			{ DEFAULT,
					DISK_LABEL,
					DISK_NUM,
					ETHERNET };
	const int num_strategies = sizeof(strategies) / sizeof(strategies[0]);
	std::ifstream test_idfile_exist(idfileLocation);
    if (!test_idfile_exist.good()){
        generate_reference_file(idfileLocation, strategies, num_strategies);
    }
    else{
        std::istream_iterator<string> start(test_idfile_exist), end;
        std::vector<string> reference_signatures(start, end);
        test_idfile_exist.close();
        if (reference_signatures.size() != num_strategies ||
            std::find(reference_signatures.begin(), reference_signatures.end(), "0000-0000-0000-0000") != reference_signatures.end())
            generate_reference_file(idfileLocation, strategies, num_strategies);
    }
    std::ifstream is(idfileLocation);
    std::istream_iterator<string> start(is), end;
    std::vector<string> reference_signatures(start, end);
	BOOST_TEST_CHECKPOINT("Generating current signatures and comparing with past");
	for (int i = 0; i < num_strategies; i++) {
        PcSignature generated_identifier;
		FUNCTION_RETURN generate_ok = generate_user_pc_signature(
				generated_identifier, strategies[i]);
		BOOST_ASSERT(generate_ok == FUNCTION_RETURN::FUNC_RET_OK);
        if (generate_ok != FUNC_RET_OK){
			BOOST_ERROR("Generating identifier for strategy " << strategies[i] << " failed with: " << generate_ok);
            continue;
        }
		if (reference_signatures[i] != generated_identifier) {
			string message = string("pc signature compare fail: strategy: ")
					+ to_string(static_cast<long long>(strategies[i])) + " generated: ["
					+ generated_identifier + "] reference: ["
					+ reference_signatures[i] + "]";
			BOOST_ERROR(message);
		}
	}
	BOOST_TEST_CHECKPOINT("Verifying signatures");
	for (int j = 0; j < 100; j++) {
		for (unsigned int i = 0; i < reference_signatures.size(); i++) {
            if (reference_signatures[i] == "0000-0000-0000-0000")
                continue;
			PcSignature pcsig;
			strncpy(pcsig, reference_signatures[i].c_str(),
					sizeof(PcSignature)-1);
			EVENT_TYPE val_result = validate_pc_signature(pcsig);
			BOOST_TEST_CHECKPOINT("Verifying signature: ");
			BOOST_CHECK_EQUAL(val_result, LICENSE_OK);
		}
	}
}